

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O2

void __thiscall StreamSummary<4U>::Add_Counter(StreamSummary<4U> *this,Data<4U> *data,bool empty)

{
  StreamBucket **ppSVar1;
  StreamBucket *prev;
  Node<int> *pNVar2;
  Node<Data<4U>_> *this_00;
  StreamBucket **ppSVar3;
  StreamCounter *counter;
  mapped_type *ppSVar4;
  int iVar5;
  undefined7 in_register_00000011;
  
  iVar5 = (int)CONCAT71(in_register_00000011,empty);
  ppSVar1 = &this->min_bucket;
  ppSVar3 = (StreamBucket **)&(this->min_bucket->super_Node<int>).next;
  if (iVar5 != 0) {
    ppSVar3 = ppSVar1;
  }
  prev = *ppSVar3;
  counter = (StreamCounter *)operator_new(0x20);
  *(undefined4 *)(counter->super_Node<Data<4U>_>).ID.str = *(undefined4 *)data->str;
  (counter->super_Node<Data<4U>_>).prev = (Node<Data<4U>_> *)0x0;
  (counter->super_Node<Data<4U>_>).next = (Node<Data<4U>_> *)0x0;
  counter->parent = (StreamBucket *)0x0;
  Add_Bucket(this,prev,counter);
  ppSVar4 = std::__detail::
            _Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->mp,data);
  *ppSVar4 = counter;
  if (iVar5 != 0) {
    return;
  }
  pNVar2 = ((*ppSVar1)->super_Node<int>).next;
  this_00 = *(Node<Data<4U>_> **)(pNVar2 + 1);
  *(Node<Data<4U>_> **)(pNVar2 + 1) = this_00->next;
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->mp)._M_h,this_00);
  Node<Data<4U>_>::Delete(this_00);
  if (this_00->next == (Node<Data<4U>_> *)0x0) {
    pNVar2 = ((*ppSVar1)->super_Node<int>).next;
    Node<int>::Delete(pNVar2);
    operator_delete(pNVar2,0x20);
  }
  operator_delete(this_00,0x20);
  return;
}

Assistant:

void Add_Counter(const Data<DATA_LEN>& data, bool empty) {
		StreamBucket* prev = empty ? min_bucket : (StreamBucket*)min_bucket->next;

		StreamCounter* add = new StreamCounter(data);
		Add_Bucket(prev, add);
		mp[data] = add;

		if (!empty) {
			StreamCounter* temp = Min_Bucket()->child;
			Min_Bucket()->child = (StreamCounter*)temp->next;
			mp.erase(temp->ID);
			temp->Delete();
			if (temp->next == NULL) {
				StreamBucket* bucket = (StreamBucket*)min_bucket->next;
				bucket->Delete();
				delete bucket;
			}
			delete temp;
		}
	}